

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall TcpSocketImpl::SelectThread(TcpSocketImpl *this)

{
  atomic_uchar *paVar1;
  socklen_t sVar2;
  int iVar3;
  int iVar4;
  undefined8 __args_1;
  int *piVar5;
  BaseSocket *pBVar6;
  undefined8 uVar7;
  BaseSocketImpl *pBVar8;
  ulong uVar9;
  bool bVar10;
  bool bReadCall;
  bool bZeroReceived;
  socklen_t iLen;
  __array tmp;
  timeval timeout;
  fd_set readfd;
  mutex mxNotify;
  fd_set errorfd;
  undefined1 local_1ee;
  bool local_1ed;
  socklen_t local_1ec;
  timespec local_1e8;
  void *local_1d8;
  ulong local_1d0;
  undefined8 local_1c8;
  _Any_data *local_1c0;
  _Any_data *local_1b8;
  _Any_data *local_1b0;
  undefined8 local_1a8;
  undefined4 local_1a0;
  timeval local_198;
  int *local_180;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
  *local_178;
  _Any_data *local_170;
  timespec local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  pthread_mutex_t local_e8;
  fd_set local_b8;
  
  LOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  (paVar1->super___atomic_base<unsigned_char>)._M_i =
       (paVar1->super___atomic_base<unsigned_char>)._M_i & 0xfe;
  UNLOCK();
  local_1ee = '\0';
  local_e8._16_8_ = 0;
  local_e8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_e8.__align = 0;
  local_e8._8_8_ = 0;
  local_e8.__data.__list.__next = (__pthread_internal_list *)0x0;
  __args_1 = operator_new__(0xffff);
  local_1d0 = 0;
  memset((void *)__args_1,0,0xffff);
  local_180 = &(this->super_BaseSocketImpl).m_iError;
  local_1c0 = (_Any_data *)&(this->super_BaseSocketImpl).m_fError;
  local_1b8 = (_Any_data *)&(this->super_BaseSocketImpl).m_fErrorParam;
  local_170 = (_Any_data *)&this->m_fnSslDecode;
  local_178 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
               *)&this->m_quInData;
  local_1b0 = (_Any_data *)&this->m_fBytesReceived;
  local_1a8 = &this->m_fBytesReceivedParam;
LAB_0011945a:
  do {
    if ((this->super_BaseSocketImpl).m_bStop != false) goto LAB_00119bec;
    if (0x80000 < (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i) {
      local_168.tv_sec = 0;
      local_168.tv_nsec = 1000000;
      do {
        iVar3 = nanosleep(&local_168,&local_168);
        if (iVar3 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
      goto LAB_0011945a;
    }
    local_198.tv_sec = 2;
    local_198.tv_usec = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_138 = 0;
    uStack_130 = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_168.tv_sec = 0;
    local_168.tv_nsec = 0;
    local_b8.fds_bits[0xe] = 0;
    local_b8.fds_bits[0xf] = 0;
    local_b8.fds_bits[0xc] = 0;
    local_b8.fds_bits[0xd] = 0;
    local_b8.fds_bits[10] = 0;
    local_b8.fds_bits[0xb] = 0;
    local_b8.fds_bits[8] = 0;
    local_b8.fds_bits[9] = 0;
    local_b8.fds_bits[6] = 0;
    local_b8.fds_bits[7] = 0;
    local_b8.fds_bits[4] = 0;
    local_b8.fds_bits[5] = 0;
    local_b8.fds_bits[2] = 0;
    local_b8.fds_bits[3] = 0;
    local_b8.fds_bits[0] = 0;
    local_b8.fds_bits[1] = 0;
    iVar3 = (this->super_BaseSocketImpl).m_fSock;
    iVar4 = iVar3 + 0x3f;
    if (-1 < iVar3) {
      iVar4 = iVar3;
    }
    uVar9 = 1L << ((byte)iVar3 & 0x3f);
    (&local_168.tv_sec)[iVar4 >> 6] = (&local_168.tv_sec)[iVar4 >> 6] | uVar9;
    local_b8.fds_bits[iVar4 >> 6] = local_b8.fds_bits[iVar4 >> 6] | uVar9;
    iVar3 = select(iVar3 + 1,(fd_set *)&local_168,(fd_set *)0x0,&local_b8,&local_198);
    bVar10 = true;
    if (0 < iVar3) {
      iVar3 = (this->super_BaseSocketImpl).m_fSock;
      iVar4 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar4 = iVar3;
      }
      if (((ulong)local_b8.fds_bits[iVar4 >> 6] >> ((ulong)(uint)(iVar3 % 0x40) & 0x3f) & 1) == 0) {
        uVar7 = __args_1;
        if (((&local_168.tv_sec)[iVar4 >> 6] & 1L << ((byte)(iVar3 % 0x40) & 0x3f)) != 0) {
          do {
            local_1c8 = uVar7;
            uVar7 = 0;
            _local_1a0 = recv((this->super_BaseSocketImpl).m_fSock,(void *)__args_1,0xffff,0);
            local_1ec = (socklen_t)_local_1a0;
            if ((int)local_1ec < 1) {
              if (local_1ec == 0) {
                iVar3 = shutdown((this->super_BaseSocketImpl).m_fSock,0);
                if (iVar3 != 0) {
                  piVar5 = __errno_location();
                  (this->super_BaseSocketImpl).m_iError = *piVar5;
                  (this->super_BaseSocketImpl).m_iErrLoc = 6;
                }
                if (local_1ee == '\x01') {
                  do {
                    local_1e8.tv_sec = 0;
                    local_1e8.tv_nsec = 10000000;
                    do {
                      iVar3 = nanosleep(&local_1e8,&local_1e8);
                      if (iVar3 != -1) break;
                      piVar5 = __errno_location();
                    } while (*piVar5 == 4);
                  } while (local_1ee != '\0');
                }
                pBVar6 = (this->super_BaseSocketImpl).m_pBkRef;
                if (pBVar6 == (BaseSocket *)0x0) {
                  pBVar6 = (BaseSocket *)0x0;
                }
                else {
                  uVar7 = 0;
                  pBVar6 = (BaseSocket *)
                           __dynamic_cast(pBVar6,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
                }
                if (pBVar6 != (BaseSocket *)0x0 &&
                    (this->m_fBytesReceivedParam).super__Function_base._M_manager !=
                    (_Manager_type)0x0) {
                  local_1d8 = (this->super_BaseSocketImpl).m_pvUserData;
                  local_1e8.tv_sec = (__time_t)pBVar6;
                  uVar7 = (*(this->m_fBytesReceivedParam)._M_invoker)
                                    ((_Any_data *)local_1a8,(TcpSocket **)&local_1e8,&local_1d8);
                  goto LAB_00119b23;
                }
                local_1d0 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
                if ((this->m_fBytesReceived).super__Function_base._M_manager != (_Manager_type)0x0
                    && pBVar6 != (BaseSocket *)0x0) {
                  local_1e8.tv_sec = (__time_t)pBVar6;
                  (*(this->m_fBytesReceived)._M_invoker)(local_1b0,(TcpSocket **)&local_1e8);
                }
              }
              else {
                piVar5 = __errno_location();
                if (*piVar5 != 0xb) {
                  (this->super_BaseSocketImpl).m_iError = *piVar5;
                  (this->super_BaseSocketImpl).m_iErrLoc = 7;
                  bVar10 = (this->super_BaseSocketImpl).m_bStop;
                  if (bVar10 == false &&
                      (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
                      (_Manager_type)0x0) {
                    local_1d8 = (this->super_BaseSocketImpl).m_pvUserData;
                    local_1e8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
                    (*(this->super_BaseSocketImpl).m_fErrorParam._M_invoker)
                              (local_1b8,(BaseSocket **)&local_1e8,&local_1d8);
                  }
                  else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                           (_Manager_type)0x0 && bVar10 == false) {
                    local_1e8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
                    (*(this->super_BaseSocketImpl).m_fError._M_invoker)
                              (local_1c0,(BaseSocket **)&local_1e8);
                  }
                }
              }
            }
            else {
              local_1ed = false;
              if ((this->m_fnSslDecode).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0011973a:
                if (BaseSocketImpl::s_fTrafficDebug.super__Function_base._M_manager !=
                    (_Manager_type)0x0) {
                  std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::
                  operator()(&BaseSocketImpl::s_fTrafficDebug,
                             (unsigned_short)(this->super_BaseSocketImpl).m_fSock,(char *)__args_1,
                             (long)(int)local_1ec,false);
                }
                sVar2 = local_1ec;
                uVar9 = (ulong)(int)local_1ec;
                pBVar6 = (BaseSocket *)operator_new__(uVar9);
                memset(pBVar6,0,uVar9);
                local_1e8.tv_sec = (__time_t)pBVar6;
                if (0 < (int)sVar2) {
                  memcpy(pBVar6,(void *)local_1c8,uVar9);
                }
                iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mxInDeque);
                __args_1 = local_1c8;
                if (iVar3 != 0) {
                  std::__throw_system_error(iVar3);
                }
                std::
                deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                ::
                emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,int&>
                          (local_178,
                           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                           &local_1e8,(int *)&local_1ec);
                LOCK();
                (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i =
                     (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i +
                     (long)(int)local_1ec;
                UNLOCK();
                pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxInDeque);
                if ((BaseSocket *)local_1e8.tv_sec != (BaseSocket *)0x0) {
                  operator_delete__((void *)local_1e8.tv_sec);
                }
                iVar3 = 0;
              }
              else {
                local_1d8 = (void *)(ulong)(local_1ec & 0x7fffffff);
                local_1e8.tv_sec = __args_1;
                iVar3 = (*(this->m_fnSslDecode)._M_invoker)
                                  (local_170,(uchar **)&local_1e8,(unsigned_long *)&local_1d8,
                                   &local_1ed);
                if (iVar3 == 0) goto LAB_0011973a;
              }
              pBVar8 = (BaseSocketImpl *)
                       ((ulong)(this->m_fBytesReceivedParam).super__Function_base._M_manager |
                       (ulong)(this->m_fBytesReceived).super__Function_base._M_manager);
              if (((pBVar8 != (BaseSocketImpl *)0x0) && (iVar3 != -1)) &&
                 ((this->super_BaseSocketImpl).m_bStop == false)) {
                iVar3 = pthread_mutex_lock(&local_e8);
                if (iVar3 != 0) {
                  std::__throw_system_error(iVar3);
                }
                if (local_1ee == '\0') {
                  local_1ee = '\x01';
                  local_1d8 = (void *)0x0;
                  local_1e8.tv_sec = (__time_t)operator_new(0x20);
                  ((BaseSocket *)local_1e8.tv_sec)->_vptr_BaseSocket =
                       (_func_int **)&PTR___State_001477a8;
                  (((BaseSocket *)local_1e8.tv_sec)->Impl_)._M_t.
                  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
                  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
                  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl =
                       (BaseSocketImpl *)&local_e8;
                  ((BaseSocket *)(local_1e8.tv_sec + 0x10))->_vptr_BaseSocket = (_func_int **)this;
                  pBVar8 = (BaseSocketImpl *)&local_1ee;
                  (((BaseSocket *)(local_1e8.tv_sec + 0x10))->Impl_)._M_t.
                  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
                  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
                  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl = pBVar8;
                  std::thread::_M_start_thread(&local_1d8,&local_1e8,0);
                  if ((BaseSocket *)local_1e8.tv_sec != (BaseSocket *)0x0) {
                    (*(*(_func_int ***)local_1e8.tv_sec)[1])();
                  }
                  std::thread::detach();
                  if (local_1d8 != (void *)0x0) {
                    std::terminate();
                  }
                }
                pthread_mutex_unlock(&local_e8);
              }
              if (local_1ed == true) {
                iVar3 = shutdown((this->super_BaseSocketImpl).m_fSock,0);
                if (iVar3 != 0) {
                  piVar5 = __errno_location();
                  (this->super_BaseSocketImpl).m_iError = *piVar5;
                  (this->super_BaseSocketImpl).m_iErrLoc = 0xe;
                }
                if (local_1ee == '\x01') {
                  do {
                    local_1e8.tv_sec = 0;
                    local_1e8.tv_nsec = 10000000;
                    do {
                      iVar3 = nanosleep(&local_1e8,&local_1e8);
                      if (iVar3 != -1) break;
                      piVar5 = __errno_location();
                    } while (*piVar5 == 4);
                  } while (local_1ee != '\0');
                }
                pBVar6 = (this->super_BaseSocketImpl).m_pBkRef;
                if (pBVar6 == (BaseSocket *)0x0) {
                  pBVar6 = (BaseSocket *)0x0;
                }
                else {
                  pBVar8 = (BaseSocketImpl *)0x0;
                  pBVar6 = (BaseSocket *)
                           __dynamic_cast(pBVar6,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
                }
                if (pBVar6 == (BaseSocket *)0x0 ||
                    (this->m_fBytesReceivedParam).super__Function_base._M_manager ==
                    (_Manager_type)0x0) {
                  local_1d0 = CONCAT71((int7)((ulong)pBVar8 >> 8),1);
                  if ((this->m_fBytesReceived).super__Function_base._M_manager != (_Manager_type)0x0
                      && pBVar6 != (BaseSocket *)0x0) {
                    local_1e8.tv_sec = (__time_t)pBVar6;
                    (*(this->m_fBytesReceived)._M_invoker)(local_1b0,(TcpSocket **)&local_1e8);
                  }
                }
                else {
                  local_1d8 = (this->super_BaseSocketImpl).m_pvUserData;
                  local_1e8.tv_sec = (__time_t)pBVar6;
                  uVar7 = (*(this->m_fBytesReceivedParam)._M_invoker)
                                    ((_Any_data *)local_1a8,(TcpSocket **)&local_1e8,&local_1d8);
LAB_00119b23:
                  local_1d0 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
                }
              }
            }
            iVar3 = (this->super_BaseSocketImpl).m_fSock;
            iVar4 = (this->super_BaseSocketImpl).m_iError;
          } while (((0 < (int)local_1a0) && ((this->super_BaseSocketImpl).m_bStop == false)) &&
                  ((iVar3 != -1 && ((iVar4 == 0 && (uVar7 = local_1c8, (local_1d0 & 1) == 0))))));
          if (((local_1d0 & 1) != 0) || ((iVar4 != 0xb && (iVar4 != 0)))) goto LAB_00119be2;
          bVar10 = iVar3 != -1;
        }
      }
      else {
        local_1ec = 4;
        getsockopt(iVar3,1,4,local_180,&local_1ec);
        (this->super_BaseSocketImpl).m_iErrLoc = 5;
        bVar10 = (this->super_BaseSocketImpl).m_bStop;
        if (bVar10 == false &&
            (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
            (_Manager_type)0x0) {
          local_1d8 = (this->super_BaseSocketImpl).m_pvUserData;
          local_1e8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
          (*(this->super_BaseSocketImpl).m_fErrorParam._M_invoker)
                    (local_1b8,(BaseSocket **)&local_1e8,&local_1d8);
        }
        else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                 (_Manager_type)0x0 && bVar10 == false) {
          local_1e8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
          (*(this->super_BaseSocketImpl).m_fError._M_invoker)(local_1c0,(BaseSocket **)&local_1e8);
        }
LAB_00119be2:
        bVar10 = false;
      }
    }
    if (!bVar10) {
LAB_00119bec:
      if (((((local_1d0 & 1) == 0) && ((this->super_BaseSocketImpl).m_iError == 0)) &&
          (iVar3 = (this->super_BaseSocketImpl).m_fSock, iVar3 != -1)) &&
         (iVar3 = shutdown(iVar3,0), iVar3 != 0)) {
        piVar5 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar5;
        (this->super_BaseSocketImpl).m_iErrLoc = 8;
      }
      if (local_1ee == '\x01') {
        do {
          local_168.tv_sec = 0;
          local_168.tv_nsec = 10000000;
          do {
            iVar3 = nanosleep(&local_168,&local_168);
            if (iVar3 != -1) break;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
        } while (local_1ee != '\0');
      }
      iVar3 = pthread_mutex_lock(&local_e8);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      pthread_mutex_unlock(&local_e8);
      LOCK();
      paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
      (paVar1->super___atomic_base<unsigned_char>)._M_i =
           (paVar1->super___atomic_base<unsigned_char>)._M_i | 1;
      UNLOCK();
      paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
      LOCK();
      bVar10 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (bVar10) {
        (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
      if (bVar10) {
        iVar3 = (this->super_BaseSocketImpl).m_fSock;
        if (iVar3 != -1) {
          close(iVar3);
          (this->super_BaseSocketImpl).m_fSock = -1;
        }
        (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
        if ((this->m_pRefServSocket != (TcpServer *)0x0) || (this->m_bSelfDelete == true)) {
          (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x16])(this);
        }
      }
      operator_delete__((void *)__args_1);
      return;
    }
  } while( true );
}

Assistant:

void TcpSocketImpl::SelectThread()
{
    m_iShutDownState &= static_cast<uint8_t>(~1);

    bool bReadCall = false;
    mutex mxNotify;
    bool bSocketShutDown = false;
	auto buf = make_unique<char[]>(0x0000ffff);

    while (m_bStop == false)
    {
        if (m_atInBytes > 0x80000)  // More than 512 KB in the receive buffer
        {
            this_thread::sleep_for(chrono::milliseconds(1));
            continue;
        }

        fd_set readfd{}, errorfd{};
        struct timeval timeout{};

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);
        FD_ZERO(&errorfd);

        FD_SET(m_fSock, &readfd);
        FD_SET(m_fSock, &errorfd);

        if (::select(static_cast<int>(m_fSock + 1), &readfd, nullptr, &errorfd, &timeout) > 0)
        {
            if (FD_ISSET(m_fSock, &errorfd))
            {
                socklen_t iLen = sizeof(m_iError);
                getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                m_iErrLoc = 5;
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                break;
            }

            if (FD_ISSET(m_fSock, &readfd))
            {
                do
                {
                    int32_t transferred = ::recv(m_fSock, &buf[0], 0x0000ffff, 0);

                    if (transferred <= 0)
                    {
                        if (transferred == 0)
                        {   // The connection was shutdown from the other side, there will be no more bytes to read on that connection
                            // We set the flag, so we don't read on the connection any more

                            if (::shutdown(m_fSock, SD_RECEIVE) != 0)
                            {
                                m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
                                m_iErrLoc = 6;
                            }
                            bSocketShutDown = true;

                            while (bReadCall == true)
                                this_thread::sleep_for(chrono::milliseconds(10));

                            TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                            if (m_fBytesReceivedParam && pTcpSocket != nullptr)
                                m_fBytesReceivedParam(pTcpSocket, m_pvUserData);
                            else if (m_fBytesReceived && pTcpSocket != nullptr)
                                m_fBytesReceived(pTcpSocket);
                        }
                        else
                        {
                            const int iError = WSAGetLastError();
                            if (iError != WSAEWOULDBLOCK)
                            {
                                m_iError = iError;
                                m_iErrLoc = 7;
                                if (m_fErrorParam && m_bStop == false)
                                    m_fErrorParam(m_pBkRef, m_pvUserData);
                                else if (m_fError && m_bStop == false)
                                    m_fError(m_pBkRef);
                            }
                        }
                        break;
                    }
                    else
                    {
                        bool bZeroReceived = false;
                        int iRet = 0;
                        if (m_fnSslDecode == nullptr || (iRet = m_fnSslDecode(reinterpret_cast<const uint8_t*>(&buf[0]), transferred, bZeroReceived), iRet == 0))
                        {
                            if (s_fTrafficDebug != nullptr)
                                s_fTrafficDebug(static_cast<uint16_t>(m_fSock), &buf[0], transferred, false);

                            auto tmp = make_unique<uint8_t[]>(transferred);
                            copy_n(&buf[0], transferred, &tmp[0]);
                            lock_guard<mutex> lock(m_mxInDeque);
                            m_quInData.emplace_back(move(tmp), transferred);
                            m_atInBytes += transferred;
                        }

                        if ((m_fBytesReceived || m_fBytesReceivedParam) && m_bStop == false && iRet != -1)
                        {
                            lock_guard<mutex> lock(mxNotify);
                            if (bReadCall == false)
                            {
                                bReadCall = true;
                                thread([&]()
                                {
                                    mxNotify.lock();
                                    m_mxInDeque.lock();
                                    while (m_atInBytes > 0 && m_bStop == false)
                                    {
                                        m_mxInDeque.unlock();
                                        mxNotify.unlock();
                                        TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                                        if (m_fBytesReceivedParam != nullptr && pTcpSocket != nullptr)
                                            m_fBytesReceivedParam(pTcpSocket, m_pvUserData);
                                        else if (m_fBytesReceived != nullptr && pTcpSocket != nullptr)
                                            m_fBytesReceived(pTcpSocket);
                                        mxNotify.lock();
                                        m_mxInDeque.lock();
                                    }
                                    bReadCall = false;
                                    m_mxInDeque.unlock();
                                    mxNotify.unlock();
                                }).detach();
                            }
                        }

                        if (bZeroReceived == true)
                        {
                            if (::shutdown(m_fSock, SD_RECEIVE) != 0)
                            {
                                m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
                                m_iErrLoc = 14;
                            }
                            bSocketShutDown = true;

                            while (bReadCall == true)
                                this_thread::sleep_for(chrono::milliseconds(10));

                            TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                            if (m_fBytesReceivedParam && pTcpSocket != nullptr)
                                m_fBytesReceivedParam(pTcpSocket, m_pvUserData);
                            else if (m_fBytesReceived && pTcpSocket != nullptr)
                                m_fBytesReceived(pTcpSocket);
                        }
                    }
                } while (m_bStop == false && m_fSock != INVALID_SOCKET && m_iError == 0 && bSocketShutDown == false);

                if (bSocketShutDown == true || (m_iError != 0 && m_iError != WSAEWOULDBLOCK) || m_fSock == INVALID_SOCKET)
                    break;
            }
        }// if select
    }//while

    // if we are here, bStop is set,or m_iShutDownState has bit 1 set, or we have an error

    if (bSocketShutDown == false && m_iError == 0 && m_fSock != INVALID_SOCKET)
    {
        if (::shutdown(m_fSock, SD_RECEIVE) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error RECEIVE shutdown socket\r\n");
            m_iErrLoc = 8;
        }
    }

    while (bReadCall == true)
        this_thread::sleep_for(chrono::milliseconds(10));

    mxNotify.lock();    // in rare cases, bReadCall was set to false, and the task switch
    mxNotify.unlock();  // ended that thread before the lambda thread released mxNotify -> crash

    m_iShutDownState |= 1;

    unsigned char cExpected = 7;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }

        StartClosingCB();

        // if it is a auto-delete class we start the auto-delete thread now
        if (m_pRefServSocket != nullptr || m_bSelfDelete == true)    // Auto-delete, socket created from server socket
             Delete();// thread([&]() { delete this; }).detach();
    }
}